

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O3

void OpenSteer::drawCircleOrDisk
               (float radius,Vec3 *axis,Vec3 *center,Color *color,int segments,bool filled,bool in3d
               )

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ulong uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined1 auVar8 [16];
  PFNGLCOLOR3FPROC p_Var9;
  Vec3 *pVVar10;
  float *pfVar11;
  ulong uVar12;
  Color *extraout_RDX;
  Color *pCVar13;
  Color *extraout_RDX_00;
  undefined3 in_register_00000081;
  uint uVar14;
  uint uVar15;
  undefined4 in_register_00000084;
  undefined3 in_register_00000089;
  int iVar16;
  GLenum GVar17;
  int iVar18;
  undefined4 extraout_XMM0_Da;
  float fVar19;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  float fVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  float fVar24;
  uint uVar25;
  uint uVar30;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  GLfloat GVar31;
  float fVar32;
  GLfloat GVar35;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  Vec3 VVar36;
  char cVar37;
  float local_a4;
  undefined8 local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  float local_78;
  LocalSpaceMixin<OpenSteer::AbstractLocalSpace> local_68;
  undefined1 auVar29 [16];
  
  iVar16 = CONCAT31(in_register_00000089,in3d);
  uVar14 = CONCAT31(in_register_00000081,filled);
  uVar12 = (ulong)(uint)segments;
  local_68.super_AbstractLocalSpace._vptr_AbstractLocalSpace =
       (_func_int **)&PTR__AbstractLocalSpace_00175730;
  local_68._forward.x = 0.0;
  local_68._forward.y = 0.0;
  local_68._side.x = -1.0;
  local_68._side.y = 0.0;
  local_68._side.z = 0.0;
  local_68._up.x = 0.0;
  local_68._up.y = 1.0;
  local_68._up.z = 0.0;
  local_68._forward.z = 1.0;
  local_68._position.x = 0.0;
  local_68._position.y = 0.0;
  local_68._position.z = 0.0;
  pCVar13 = color;
  pVVar10 = center;
  uVar15 = uVar14;
  iVar18 = segments;
  local_78 = radius;
  if (iVar16 != 0) {
    uVar4._0_4_ = axis->x;
    uVar4._4_4_ = axis->y;
    local_98._8_8_ = 0;
    local_98._0_8_ = uVar4;
    fVar19 = axis->z;
    fVar24 = SQRT(fVar19 * fVar19 +
                  (float)(undefined4)uVar4 * (float)(undefined4)uVar4 +
                  (float)uVar4._4_4_ * (float)uVar4._4_4_);
    if (0.0 < fVar24) {
      auVar34._4_4_ = fVar24;
      auVar34._0_4_ = fVar24;
      auVar34._8_4_ = fVar24;
      auVar34._12_4_ = fVar24;
      local_98 = divps(local_98,auVar34);
    }
    uVar21 = 0;
    uVar22 = 0;
    uVar23 = 0;
    local_88 = ZEXT416(~-(uint)(0.0 < fVar24) & (uint)fVar19 |
                       (uint)(fVar19 / fVar24) & -(uint)(0.0 < fVar24));
    VVar36 = findPerpendicularIn3d(axis);
    local_68._forward.z = VVar36.z;
    fVar19 = VVar36.x;
    fVar24 = VVar36.y;
    auVar26._4_4_ = uVar21;
    auVar26._0_4_ = local_68._forward.z;
    auVar26._8_4_ = uVar22;
    auVar26._12_4_ = uVar23;
    auVar27._4_12_ = auVar26._4_12_;
    auVar27._0_4_ =
         SQRT(local_68._forward.z * local_68._forward.z + fVar19 * fVar19 + fVar24 * fVar24);
    iVar18 = (int)CONCAT71((int7)(uVar12 >> 8),0.0 < auVar27._0_4_);
    if (0.0 < auVar27._0_4_) {
      local_68._forward.z = local_68._forward.z / auVar27._0_4_;
    }
    local_68._up.x = local_98._0_4_;
    local_68._up.y = local_98._4_4_;
    local_68._up.z = (float)local_88._0_4_;
    auVar29._0_8_ = auVar27._0_8_;
    auVar29._8_4_ = uVar21;
    auVar29._12_4_ = uVar21;
    auVar28._8_8_ = auVar29._8_8_;
    auVar28._4_4_ = auVar27._0_4_;
    auVar28._0_4_ = auVar27._0_4_;
    auVar33._8_4_ = (int)extraout_XMM0_Qb;
    auVar33._0_8_ = VVar36._0_8_;
    auVar33._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
    auVar34 = divps(auVar33,auVar28);
    uVar30 = (uint)(0.0 < auVar27._0_4_);
    uVar25 = (int)(uVar30 << 0x1f) >> 0x1f;
    uVar30 = (int)(uVar30 << 0x1f) >> 0x1f;
    local_68._forward._0_8_ =
         CONCAT44(~uVar30 & (uint)fVar24,~uVar25 & (uint)fVar19) |
         CONCAT44(auVar34._4_4_ & uVar30,auVar34._0_4_ & uVar25);
    uVar1 = center->x;
    uVar5 = center->y;
    local_68._position.z = center->z;
    local_68._position.x = (float)uVar1;
    local_68._position.y = (float)uVar5;
    LocalSpaceMixin<OpenSteer::AbstractLocalSpace>::setUnitSideFromForwardAndUp(&local_68);
    pCVar13 = extraout_RDX;
  }
  GVar17 = 2;
  if (filled) {
    (*glad_glPushAttrib)(0x2000);
    (*glad_glDisable)(0xb44);
    GVar17 = 6;
    pCVar13 = extraout_RDX_00;
  }
  p_Var9 = glad_glColor3f;
  local_a0 = 0;
  local_a4 = local_78;
  Color::r(color,pVVar10,pCVar13,iVar18,(char *)CONCAT44(in_register_00000084,uVar15),iVar16,uVar14)
  ;
  local_98._0_4_ = extraout_XMM0_Da;
  fVar19 = Color::g(color);
  local_88._0_4_ = fVar19;
  fVar19 = Color::b(color);
  (*p_Var9)((GLfloat)local_98._0_4_,(GLfloat)local_88._0_4_,fVar19);
  (*glad_glBegin)(GVar17);
  uVar15 = uVar14;
  if ((char)uVar14 != '\0') {
    pVVar10 = &local_68._position;
    if (!in3d) {
      pVVar10 = center;
    }
    uVar2 = pVVar10->x;
    uVar6 = pVVar10->y;
    pfVar11 = &center->z;
    if (in3d) {
      pfVar11 = &local_68._position.z;
    }
    (*glad_glVertex3f)((GLfloat)uVar2,(GLfloat)uVar6,*pfVar11);
  }
  cVar37 = (char)uVar15;
  iVar18 = (uVar14 & 0xff) + segments;
  if (iVar18 != 0 && SCARRY4(uVar14 & 0xff,segments) == iVar18 < 0) {
    fVar20 = 6.2831855 / (float)segments;
    local_88._0_4_ = fVar20;
    fVar24 = 0.0;
    fVar19 = 0.0;
    auVar8._12_4_ = 0;
    auVar8._0_12_ = local_98._4_12_;
    local_98 = auVar8 << 0x20;
    fVar32 = local_78;
    do {
      local_78 = fVar19;
      if (in3d) {
        (*local_68.super_AbstractLocalSpace._vptr_AbstractLocalSpace[0xf])(&local_68,&local_a4);
        GVar31 = local_68._position.x + (float)extraout_XMM0_Qa;
        GVar35 = local_68._position.y + (float)((ulong)extraout_XMM0_Qa >> 0x20);
        pfVar11 = &local_68._position.z;
        fVar24 = fVar20;
      }
      else {
        uVar3 = center->x;
        uVar7 = center->y;
        GVar31 = fVar32 + (float)uVar3;
        GVar35 = (float)local_a0 + (float)uVar7;
        pfVar11 = &center->z;
      }
      (*glad_glVertex3f)(GVar31,GVar35,fVar24 + *pfVar11);
      fVar19 = local_78;
      if (((((float)local_98._0_4_ == 0.0) && (!NAN((float)local_98._0_4_))) && (local_78 == 0.0))
         && (!NAN(local_78))) {
        fVar19 = sinf((float)local_88._0_4_);
        local_98._0_4_ = fVar19;
        fVar19 = cosf((float)local_88._0_4_);
      }
      cVar37 = (char)uVar15;
      fVar20 = (float)local_98._0_4_ * local_a4;
      fVar32 = local_a4 * fVar19 + (float)local_98._0_4_ * local_a0._4_4_;
      fVar24 = local_a0._4_4_ * fVar19 - fVar20;
      local_a0 = CONCAT44(fVar24,(float)local_a0);
      iVar18 = iVar18 + -1;
      local_a4 = fVar32;
    } while (iVar18 != 0);
  }
  (*glad_glEnd)();
  if (cVar37 != '\0') {
    (*glad_glPopAttrib)();
  }
  return;
}

Assistant:

void 
OpenSteer::drawCircleOrDisk (const float radius,
                             const Vec3& axis,
                             const Vec3& center,
                             const Color& color,
                             const int segments,
                             const bool filled,
                             const bool in3d)
{
    LocalSpace ls;
    if (in3d)
    {
        // define a local space with "axis" as the Y/up direction
        // (XXX should this be a method on  LocalSpace?)
        const Vec3 unitAxis = axis.normalize ();
        const Vec3 unitPerp = findPerpendicularIn3d (axis).normalize ();
        ls.setUp (unitAxis);
        ls.setForward (unitPerp);
        ls.setPosition (center);
        ls.setUnitSideFromForwardAndUp ();
    }
        
    // make disks visible (not culled) from both sides 
    if (filled) beginDoubleSidedDrawing ();

    // point to be rotated about the (local) Y axis, angular step size
    Vec3 pointOnCircle (radius, 0, 0);
    const float step = (2 * OPENSTEER_M_PI) / segments;

    // set drawing color
    glColor3f (color.r(), color.g(), color.b());

    // begin drawing a triangle fan (for disk) or line loop (for circle)
    glBegin (filled ? GL_TRIANGLE_FAN : GL_LINE_LOOP);

    // for the filled case, first emit the center point
    if (filled) iglVertexVec3 (in3d ? ls.position() : center);

    // rotate p around the circle in "segments" steps
    float sin=0, cos=0;
    const int vertexCount = filled ? segments+1 : segments;
    for (int i = 0; i < vertexCount; i++)
    {
        // emit next point on circle, either in 3d (globalized out
        // of the local space), or in 2d (offset from the center)
        iglVertexVec3 (in3d ?
                           ls.globalizePosition (pointOnCircle) :
                           (Vec3) (pointOnCircle + center));

        // rotate point one more step around circle
        pointOnCircle = pointOnCircle.rotateAboutGlobalY (step, sin, cos);
    }

    // close drawing operation
    glEnd ();
    if (filled) endDoubleSidedDrawing ();
}